

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpath::detail::
or_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::evaluate
          (or_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,const_reference lhs,const_reference rhs,error_code *param_4)

{
  bool bVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RCX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  
  this_00 = in_RDI;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null(in_RDX);
  if ((bVar1) &&
     (bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null(in_RDX),
     bVar1)) {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json(this_00,in_RDI);
    uVar2 = extraout_RDX;
  }
  else {
    bVar1 = is_false<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                      (in_RCX);
    if (bVar1) {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json(this_00,in_RDI);
      uVar2 = extraout_RDX_01;
    }
    else {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json(this_00,in_RDI);
      uVar2 = extraout_RDX_00;
    }
  }
  bVar3.field_0.int64_.val_ = uVar2;
  bVar3.field_0._0_8_ = this_00;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar3.field_0;
}

Assistant:

Json evaluate(const_reference lhs, const_reference rhs, std::error_code&) const override
        {
            if (lhs.is_null() && rhs.is_null())
            {
                return Json::null();
            }
            if (!is_false(lhs))
            {
                return lhs;
            }
            return rhs;
        }